

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> * __thiscall
cfd::core::Psbt::GetTxInKeyDataList
          (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__return_storage_ptr__,
          Psbt *this,uint32_t index)

{
  void *pvVar1;
  size_type __n;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  size_type sVar6;
  value_type_conflict2 *__x;
  ByteData fingerprint;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  Pubkey pubkey;
  ByteData key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1d0 [24];
  KeyData local_1b8;
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xa67,"GetTxInKeyDataList");
  pvVar1 = this->wally_psbt_pointer_;
  __n = *(size_type *)(*(long *)((long)pvVar1 + 0x10) + 0x50 + (ulong)index * 0x110);
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::reserve
            (__return_storage_ptr__,__n);
  for (sVar6 = 0; sVar6 != __n; sVar6 = sVar6 + 1) {
    lVar4 = *(long *)(*(long *)((long)pvVar1 + 0x10) + 0x48 + (ulong)index * 0x110);
    lVar5 = sVar6 * 0x20;
    ByteData::ByteData(&key,*(uint8_t **)(lVar4 + lVar5),*(uint32_t *)(lVar4 + 8 + lVar5));
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_1d0,&key.data_);
    Pubkey::Pubkey(&pubkey,(ByteData *)local_1d0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
    ByteData::ByteData(&fingerprint);
    path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar4 = lVar4 + lVar5;
    path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (*(ulong *)(lVar4 + 0x18) != 0 && (*(ulong *)(lVar4 + 0x18) & 3) == 0) {
      ByteData::ByteData((ByteData *)&local_1b8,*(uint8_t **)(lVar4 + 0x10),4);
      ByteData::operator=(&fingerprint,(ByteData *)&local_1b8);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b8);
      __x = *(value_type_conflict2 **)(lVar4 + 0x10);
      uVar2 = *(ulong *)(lVar4 + 0x18);
      for (uVar3 = 1; __x = __x + 1, uVar3 < uVar2 >> 2; uVar3 = uVar3 + 1) {
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,__x);
      }
    }
    KeyData::KeyData(&local_1b8,&pubkey,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                     &fingerprint);
    ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
    emplace_back<cfd::core::KeyData>(__return_storage_ptr__,&local_1b8);
    KeyData::~KeyData(&local_1b8);
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<KeyData> Psbt::GetTxInKeyDataList(uint32_t index) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  size_t key_max = psbt_pointer->inputs[index].keypaths.num_items;
  std::vector<KeyData> arr;
  arr.reserve(key_max);
  struct wally_map_item *item;
  for (size_t key_index = 0; key_index < key_max; ++key_index) {
    item = &psbt_pointer->inputs[index].keypaths.items[key_index];
    ByteData key(item->key, static_cast<uint32_t>(item->key_len));
    Pubkey pubkey(key);
    ByteData fingerprint;
    std::vector<uint32_t> path;
    if (((item->value_len % 4) == 0) && (item->value_len > 0)) {
      fingerprint = ByteData(item->value, 4);

      // TODO(k-matsuzawa) Need endian support.
      size_t arr_max = item->value_len / 4;
      uint32_t *val_arr = reinterpret_cast<uint32_t *>(item->value);
      for (size_t arr_index = 1; arr_index < arr_max; ++arr_index) {
        path.push_back(val_arr[arr_index]);
      }
    }
    arr.emplace_back(KeyData(pubkey, path, fingerprint));
  }
  return arr;
}